

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaElementPtr
xmlSchemaCheckSubstGroupCircular(xmlSchemaElementPtr elemDecl,xmlSchemaElementPtr ancestor)

{
  xmlSchemaElementPtr ret;
  xmlSchemaElementPtr ancestor_local;
  xmlSchemaElementPtr elemDecl_local;
  
  if (ancestor->refDecl == (_xmlSchemaElement *)0x0) {
    elemDecl_local = (xmlSchemaElementPtr)0x0;
  }
  else {
    elemDecl_local = ancestor;
    if (ancestor->refDecl != elemDecl) {
      if ((ancestor->refDecl->flags & 0x200U) == 0) {
        ancestor->refDecl->flags = ancestor->refDecl->flags | 0x200;
        elemDecl_local = xmlSchemaCheckSubstGroupCircular(elemDecl,ancestor->refDecl);
        ancestor->refDecl->flags = ancestor->refDecl->flags ^ 0x200;
      }
      else {
        elemDecl_local = (xmlSchemaElementPtr)0x0;
      }
    }
  }
  return elemDecl_local;
}

Assistant:

static xmlSchemaElementPtr
xmlSchemaCheckSubstGroupCircular(xmlSchemaElementPtr elemDecl,
				 xmlSchemaElementPtr ancestor)
{
    xmlSchemaElementPtr ret;

    if (WXS_SUBST_HEAD(ancestor) == NULL)
	return (NULL);
    if (WXS_SUBST_HEAD(ancestor) == elemDecl)
	return (ancestor);

    if (WXS_SUBST_HEAD(ancestor)->flags & XML_SCHEMAS_ELEM_CIRCULAR)
	return (NULL);
    WXS_SUBST_HEAD(ancestor)->flags |= XML_SCHEMAS_ELEM_CIRCULAR;
    ret = xmlSchemaCheckSubstGroupCircular(elemDecl,
	WXS_SUBST_HEAD(ancestor));
    WXS_SUBST_HEAD(ancestor)->flags ^= XML_SCHEMAS_ELEM_CIRCULAR;

    return (ret);
}